

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

boolean drown(void)

{
  boolean bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  bool bVar7;
  boolean local_19;
  int local_18;
  boolean succ;
  int iStack_14;
  boolean lost;
  int y;
  int x;
  int i;
  boolean crawl_ok;
  boolean inpool_ok;
  
  x._2_1_ = '\0';
  if (((((byte)u._1052_1_ >> 1 & 1) != 0) &&
      (bVar1 = is_pool(level,(int)u.ux0,(int)u.uy0), bVar1 != '\0')) &&
     (((u.uprops[0x39].intrinsic != 0 ||
       ((u.uprops[0x39].extrinsic != 0 || (((youmonst.data)->mflags1 & 2) != 0)))) ||
      (((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 2) != 0)) ||
       (((u.uprops[0x31].intrinsic != 0 || (u.uprops[0x31].extrinsic != 0)) ||
        (((youmonst.data)->mflags1 & 0x600) != 0)))))))) {
    iVar3 = rn2(5);
    if (iVar3 != 0) {
      return '\0';
    }
    x._2_1_ = '\x01';
  }
  if (((byte)u._1052_1_ >> 1 & 1) == 0) {
    bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
    pcVar4 = "fall";
    if (bVar1 != '\0') {
      pcVar4 = "plunge";
    }
    bVar7 = true;
    if (((((u.uprops[0x31].intrinsic == 0) && (bVar7 = true, u.uprops[0x31].extrinsic == 0)) &&
         ((bVar7 = true, ((youmonst.data)->mflags1 & 0x600) == 0 &&
          ((bVar7 = true, u.uprops[0x39].intrinsic == 0 &&
           (bVar7 = true, u.uprops[0x39].extrinsic == 0)))))) &&
        (bVar7 = true, ((youmonst.data)->mflags1 & 2) == 0)) &&
       (bVar7 = false, u.usteed != (monst *)0x0)) {
      bVar7 = ((u.usteed)->data->mflags1 & 2) != 0;
    }
    uVar5 = 0x21;
    if (bVar7) {
      uVar5 = 0x2e;
    }
    pline("You %s into the water%c",pcVar4,uVar5);
    if (((((u.uprops[0x39].intrinsic == 0) && (u.uprops[0x39].extrinsic == 0)) &&
         (((youmonst.data)->mflags1 & 2) == 0)) &&
        ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))) &&
       (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
      bVar7 = false;
      if (u.uprops[0x23].intrinsic != 0) {
        bVar7 = true;
        if ((u.uprops[0x24].extrinsic == 0) && (bVar7 = false, u.umonnum != u.umonster)) {
          bVar1 = dmgtype(youmonst.data,0x24);
          bVar7 = bVar1 != '\0';
        }
        bVar7 = (bool)(bVar7 ^ 1);
      }
      pcVar4 = "a rock";
      if (bVar7) {
        pcVar4 = "the Titanic";
      }
      pline("You sink like %s.",pcVar4);
    }
  }
  water_damage(invent,'\0','\0');
  if ((u.umonnum == 0x29) && (iVar3 = rn2(3), iVar3 != 0)) {
    split_mon(&youmonst,(monst *)0x0);
  }
  else if (u.umonnum == 0x10a) {
    pline("You rust!");
    y = dice(2,6);
    if (y < u.mhmax) {
      u.mhmax = u.mhmax - y;
    }
    losehp(y,"rusting away",1);
  }
  if (x._2_1_ == '\0') {
    y = number_leashed();
    if (0 < y) {
      pcVar4 = "";
      if (1 < y) {
        pcVar4 = "es";
      }
      pcVar6 = "s";
      if (1 < y) {
        pcVar6 = "";
      }
      pline("The leash%s slip%s loose.",pcVar4,pcVar6);
      unleash_all();
    }
    if ((((((u.uprops[0x31].intrinsic == 0) && (u.uprops[0x31].extrinsic == 0)) &&
          (((youmonst.data)->mflags1 & 0x600) == 0)) &&
         ((u.uprops[0x39].intrinsic == 0 && (u.uprops[0x39].extrinsic == 0)))) &&
        (((youmonst.data)->mflags1 & 2) == 0)) &&
       ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))) {
      if (((((u.uprops[0xe].intrinsic != 0) || (u.uprops[0xe].extrinsic != 0)) ||
           (((youmonst.data)->mflags1 & 0x2000000) != 0)) ||
          (((youmonst.data)->mflags1 & 0x2000000) != 0)) &&
         ((u.usleep == 0 &&
          (((u.uprops[0xf].intrinsic != 0 || (u.uprops[0xf].extrinsic != 0)) ||
           ((((youmonst.data)->mflags1 & 0x4000000) != 0 ||
            (iVar3 = rn2(3), iVar3 < (int)u.uluck + (int)u.moreluck + 2)))))))) {
        pline("You attempt a teleport spell.");
        if ((*(uint *)&(level->flags).field_0x8 >> 0xb & 1) == 0) {
          dotele();
          bVar1 = is_pool(level,(int)u.ux,(int)u.uy);
          if (bVar1 == '\0') {
            return '\x01';
          }
        }
        else {
          pline("The attempted teleport spell fails.");
        }
      }
      if (u.usteed != (monst *)0x0) {
        dismount_steed(0);
        bVar1 = is_pool(level,(int)u.ux,(int)u.uy);
        if (bVar1 == '\0') {
          return '\x01';
        }
      }
      x._1_1_ = '\0';
      local_18 = 0;
      iStack_14 = 0;
      if (u.usleep != 0) {
        unmul("Suddenly you wake up!");
      }
      if ((-1 < multi) && ((u.umonnum == u.umonster || ((youmonst.data)->mmove != '\0')))) {
        for (y = 0; y < 100; y = y + 1) {
          iStack_14 = rn2(3);
          iStack_14 = iStack_14 + u.ux + -1;
          local_18 = rn2(3);
          local_18 = local_18 + u.uy + -1;
          bVar1 = goodpos(level,iStack_14,local_18,&youmonst,0);
          if (bVar1 != '\0') {
            x._1_1_ = '\x01';
            goto LAB_0031124b;
          }
        }
        for (iStack_14 = u.ux + -1; iStack_14 <= u.ux + 1; iStack_14 = iStack_14 + 1) {
          for (local_18 = u.uy + -1; local_18 <= u.uy + 1; local_18 = local_18 + 1) {
            bVar1 = goodpos(level,iStack_14,local_18,&youmonst,0);
            if (bVar1 != '\0') {
              x._1_1_ = '\x01';
              goto LAB_0031124b;
            }
          }
        }
      }
LAB_0031124b:
      if (x._1_1_ != '\0') {
        local_19 = '\0';
        bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
        if (bVar1 == '\0') {
          cVar2 = emergency_disrobe(&local_19);
        }
        else {
          cVar2 = '\x01';
        }
        pline("You try to crawl out of the water.");
        if (local_19 != '\0') {
          pline("You dump some of your gear to lose weight...");
        }
        if (cVar2 != '\0') {
          pline("Pheew!  That was close.");
          teleds(iStack_14,local_18,'\x01');
          return '\x01';
        }
        pline("But in vain.");
      }
      u._1052_1_ = u._1052_1_ & 0xfd | 2;
      if ((((u.umonnum == u.umonster) || (u.uprops[0x3d].intrinsic != 0)) ||
          (u.uprops[0x3d].extrinsic != 0)) || (urace.malenum != 0xe8)) {
        pline("You drown.");
        killer_format = 0;
        bVar7 = true;
        if (level->locations[u.ux][u.uy].typ != '\x11') {
          bVar1 = on_level(&u.uz,&dungeon_topology.d_medusa_level);
          bVar7 = bVar1 != '\0';
        }
        killer = "moat";
        if (bVar7) {
          killer = "pool of water";
        }
        done(4);
        while (bVar1 = safe_teleds('\x01'), bVar1 == '\0') {
          pline("You\'re still drowning.");
          done(4);
        }
        if (((byte)u._1052_1_ >> 1 & 1) != 0) {
          u._1052_1_ = u._1052_1_ & 0xfd;
          bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
          pcVar4 = "on land";
          if (bVar1 != '\0') {
            pcVar4 = "in an air bubble";
          }
          pline("You find yourself back %s.",pcVar4);
        }
        x._3_1_ = '\x01';
      }
      else {
        rehumanize();
        u._1052_1_ = u._1052_1_ & 0xfd;
        x._3_1_ = '\x01';
      }
    }
    else {
      if ((u.uprops[0x31].intrinsic != 0) ||
         ((u.uprops[0x31].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x600) != 0)))) {
        if (flags.verbose != '\0') {
          pline("But you aren\'t drowning.");
        }
        bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
        if (bVar1 == '\0') {
          if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
             ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
            pline("You touch bottom.");
          }
          else {
            pline("Your keel hits the bottom.");
          }
        }
      }
      if (uball != (obj *)0x0) {
        unplacebc();
        placebc();
      }
      vision_recalc(2);
      u._1052_1_ = u._1052_1_ & 0xfd | 2;
      under_water(1);
      vision_full_recalc = '\x01';
      x._3_1_ = '\0';
    }
  }
  else {
    x._3_1_ = '\0';
  }
  return x._3_1_;
}

Assistant:

boolean drown(void)
{
	boolean inpool_ok = FALSE, crawl_ok;
	int i, x, y;

	/* happily wading in the same contiguous pool */
	if (u.uinwater && is_pool(level, u.ux0, u.uy0) &&
	    (Swimming || Amphibious)) {
		/* water effects on objects every now and then */
		if (!rn2(5)) inpool_ok = TRUE;
		else return FALSE;
	}

	if (!u.uinwater) {
	    pline("You %s into the water%c",
		Is_waterlevel(&u.uz) ? "plunge" : "fall",
		Amphibious || Swimming ? '.' : '!');
	    if (!Swimming && !Is_waterlevel(&u.uz))
		    pline("You sink like %s.",
			Hallucination ? "the Titanic" : "a rock");
	}

	water_damage(invent, FALSE, FALSE);

	if (u.umonnum == PM_GREMLIN && rn2(3))
	    split_mon(&youmonst, NULL);
	else if (u.umonnum == PM_IRON_GOLEM) {
	    pline("You rust!");
	    i = dice(2,6);
	    if (u.mhmax > i) u.mhmax -= i;
	    losehp(i, "rusting away", KILLED_BY);
	}
	if (inpool_ok) return FALSE;

	if ((i = number_leashed()) > 0) {
		pline("The leash%s slip%s loose.",
			(i > 1) ? "es" : "",
			(i > 1) ? "" : "s");
		unleash_all();
	}

	if (Amphibious || Swimming) {
		if (Amphibious) {
			if (flags.verbose)
				pline("But you aren't drowning.");
			if (!Is_waterlevel(&u.uz)) {
				if (Hallucination)
					pline("Your keel hits the bottom.");
				else
					pline("You touch bottom.");
			}
		}
		if (Punished) {
			unplacebc();
			placebc();
		}
		vision_recalc(2);	/* unsee old position */
		u.uinwater = 1;
		under_water(1);
		vision_full_recalc = 1;
		return FALSE;
	}
	if ((Teleportation || can_teleport(youmonst.data)) &&
		    !u.usleep && (Teleport_control || rn2(3) < Luck+2)) {
		pline("You attempt a teleport spell.");	/* utcsri!carroll */
		if (!level->flags.noteleport) {
			dotele();
			if (!is_pool(level, u.ux,u.uy))
				return TRUE;
		} else pline("The attempted teleport spell fails.");
	}
	if (u.usteed) {
		dismount_steed(DISMOUNT_GENERIC);
		if (!is_pool(level, u.ux,u.uy))
			return TRUE;
	}
	crawl_ok = FALSE;
	x = y = 0;		/* lint suppression */
	/* if sleeping, wake up now so that we don't crawl out of water
	   while still asleep; we can't do that the same way that waking
	   due to combat is handled; note unmul() clears u.usleep */
	if (u.usleep) unmul("Suddenly you wake up!");
	/* can't crawl if unable to move (crawl_ok flag stays false) */
	if (multi < 0 || (Upolyd && !youmonst.data->mmove)) goto crawl;
	/* look around for a place to crawl to */
	for (i = 0; i < 100; i++) {
		x = rn1(3,u.ux - 1);
		y = rn1(3,u.uy - 1);
		if (goodpos(level, x, y, &youmonst, 0)) {
			crawl_ok = TRUE;
			goto crawl;
		}
	}
	/* one more scan */
	for (x = u.ux - 1; x <= u.ux + 1; x++)
		for (y = u.uy - 1; y <= u.uy + 1; y++)
			if (goodpos(level, x, y, &youmonst, 0)) {
				crawl_ok = TRUE;
				goto crawl;
			}
 crawl:
	if (crawl_ok) {
		boolean lost = FALSE;
		/* time to do some strip-tease... */
		boolean succ = Is_waterlevel(&u.uz) ? TRUE :
				emergency_disrobe(&lost);

		pline("You try to crawl out of the water.");
		if (lost)
			pline("You dump some of your gear to lose weight...");
		if (succ) {
			pline("Pheew!  That was close.");
			teleds(x,y,TRUE);
			return TRUE;
		}
		/* still too much weight */
		pline("But in vain.");
	}
	u.uinwater = 1;
	/* [ALI] Vampires return to vampiric form on drowning. */
	if (Upolyd && !Unchanging && Race_if(PM_VAMPIRE)) {
		rehumanize();
		u.uinwater = 0;
		/* should be unnecessary as spoteffects() should get called */
		/* pline("You fly up out of the water!"); */
		return TRUE;
	}
	pline("You drown.");
	killer_format = KILLED_BY_AN;
	killer = (level->locations[u.ux][u.uy].typ == POOL || Is_medusa_level(&u.uz)) ?
	    "pool of water" : "moat";
	done(DROWNING);
	/* oops, we're still alive.  better get out of the water. */
	while (!safe_teleds(TRUE)) {
		pline("You're still drowning.");
		done(DROWNING);
	}
	if (u.uinwater) {
		u.uinwater = 0;
		pline("You find yourself back %s.",
		      Is_waterlevel(&u.uz) ? "in an air bubble" : "on land");
	}
	return TRUE;
}